

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<long> *out)

{
  bool bVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char *local_38;
  
  lVar5 = (long)this->buffer_end_ - (long)ptr;
  local_38 = ptr;
  do {
    uVar3 = (int)lVar5 + 0x10;
    if (size <= (int)uVar3) {
      RepeatedField<long>::Reserve(out,out->current_size_ + (size >> 3));
      uVar3 = size & 0xfffffff8;
      plVar2 = RepeatedField<long>::AddNAlreadyReserved(out,size >> 3);
      memcpy(plVar2,local_38,(long)(int)uVar3);
      if (size != uVar3) {
        return (char *)0x0;
      }
      return local_38 + (int)uVar3;
    }
    RepeatedField<long>::Reserve(out,out->current_size_ + ((int)uVar3 >> 3));
    uVar4 = uVar3 & 0xfffffff8;
    plVar2 = RepeatedField<long>::AddNAlreadyReserved(out,(int)uVar3 >> 3);
    memcpy(plVar2,local_38,(long)(int)uVar4);
    local_38 = local_38 + (int)uVar4;
    size = size - uVar4;
    bVar1 = DoneWithCheck(this,&local_38,-1);
    lVar5 = (long)this->buffer_end_ - (long)local_38;
  } while (!bVar1);
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    ptr += block_size;
    size -= block_size;
    if (DoneWithCheck(&ptr, -1)) return nullptr;
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}